

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O3

RC __thiscall SM_Manager::CalcStats(SM_Manager *this,char *relName)

{
  RM_FileHandle **ppRVar1;
  float *pfVar2;
  int iVar3;
  RC RVar4;
  size_t sVar5;
  Attr *attributes;
  int iVar6;
  long lVar7;
  long lVar8;
  RelCatEntry *rEntry;
  RM_FileHandle *pRVar9;
  long lVar10;
  Attr *pAVar11;
  float fVar12;
  RelCatEntry *relEntry;
  SM_Manager *local_1b8;
  RM_Record attrRec;
  AttrCatEntry *aEntry;
  SM_AttrIterator attrIt;
  RM_Record rec;
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  numDistinct;
  RM_Record relRec;
  RM_FileHandle fh;
  RM_FileScan fs;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Calculating stats for relation ",0x1f);
  if (relName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b1d0);
  }
  else {
    sVar5 = strlen(relName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,relName,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  sVar5 = strlen(relName);
  RVar4 = 0x12e;
  if (sVar5 < 0x19) {
    RM_Record::RM_Record(&relRec);
    RVar4 = GetRelEntry(this,relName,&relRec,&relEntry);
    rEntry = relEntry;
    if (RVar4 == 0) {
      iVar6 = relEntry->attrCount;
      local_1b8 = this;
      attributes = (Attr *)malloc((long)iVar6 * 0x30);
      if (0 < (long)iVar6) {
        lVar7 = 0;
        pAVar11 = attributes;
        do {
          pAVar11->numDistinct = 0;
          pAVar11->maxValue = 0.0;
          *(undefined8 *)&pAVar11->minValue = 0;
          *(undefined8 *)&pAVar11->ih = 0;
          pAVar11->recInsert = (_func_bool_char_ptr_string_int *)0x0;
          pAVar11->offset = 0;
          pAVar11->type = 0;
          pAVar11->length = 0;
          pAVar11->indexNo = 0;
          IX_Manager::DestroyIndex((IX_Manager *)&fs);
          attrIt.validIterator = false;
          attrIt._1_7_ = 0;
          attrIt.fs.openScan = false;
          attrIt.fs._1_7_ = 0;
          attrIt.fs.comparator = recInsert_string;
          attrIt.fs.attrOffset = 0;
          attrIt.fs._28_8_ = 0x7f7fffff00800000;
          pAVar11->offset = 0;
          pAVar11->type = 0;
          pAVar11->length = 0;
          pAVar11->indexNo = 0;
          *(undefined4 *)((long)&pAVar11->recInsert + 4) = 0;
          pAVar11->numDistinct = 0;
          pAVar11->maxValue = 1.1754944e-38;
          pAVar11->minValue = 3.4028235e+38;
          *(RM_FileHandle **)&pAVar11->ih = attrIt.fs.fileHandle;
          pAVar11->recInsert = recInsert_string;
          IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&attrIt.fs.fileHandle);
          IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&fs);
          lVar7 = lVar7 + 1;
          pAVar11 = pAVar11 + 1;
          rEntry = relEntry;
        } while (lVar7 < relEntry->attrCount);
      }
      RVar4 = PrepareAttr(local_1b8,rEntry,attributes);
      if (RVar4 == 0) {
        std::
        vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::vector(&numDistinct,(long)relEntry->attrCount,(allocator_type *)&attrIt);
        iVar6 = relEntry->attrCount;
        if (0 < (long)iVar6) {
          lVar7 = 0;
          do {
            *(undefined4 *)((long)&attributes->numDistinct + lVar7) = 0;
            *(undefined8 *)((long)&attributes->maxValue + lVar7) = 0x7f7fffff00800000;
            lVar7 = lVar7 + 0x30;
          } while ((long)iVar6 * 0x30 != lVar7);
        }
        relEntry->numTuples = 0;
        relEntry->statsInitialized = true;
        RM_FileScan::RM_FileScan(&fs);
        RM_FileHandle::RM_FileHandle(&fh);
        RM_Record::RM_Record(&rec);
        RVar4 = RM_Manager::OpenFile(local_1b8->rmm,relName,&fh);
        if (RVar4 == 0) {
          RVar4 = RM_FileScan::OpenScan(&fs,&fh,INT,0,0,NO_OP,(void *)0x0,NO_HINT);
          if (RVar4 == 0) {
            ppRVar1 = &attrIt.fs.fileHandle;
            while( true ) {
              RVar4 = RM_FileScan::GetNextRec(&fs,&rec);
              if (RVar4 == 0x6e) break;
              RVar4 = RM_Record::GetData(&rec,(char **)&attrRec);
              if (RVar4 != 0) goto LAB_0010b1bb;
              if (0 < relEntry->attrCount) {
                lVar7 = 0;
                lVar10 = 0;
                do {
                  lVar8 = (long)*(int *)((long)&attributes->offset + lVar7);
                  attrIt._0_8_ = ppRVar1;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&attrIt,(long)attrRec.rid + lVar8,
                             (long)*(int *)((long)&attributes->length + lVar7) +
                             (long)attrRec.rid + lVar8);
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)(&((numDistinct.
                                    super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                                  field_0x0 + lVar7),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &attrIt);
                  iVar6 = *(int *)((long)&attributes->type + lVar7);
                  if (iVar6 == 0) {
                    fVar12 = (float)*(int *)((long)attrRec.rid + lVar8);
                  }
                  else if (iVar6 == 2) {
                    fVar12 = (float)(int)*(char *)((long)attrRec.rid + lVar8);
                  }
                  else {
                    fVar12 = *(float *)((long)attrRec.rid + lVar8);
                  }
                  pfVar2 = (float *)((long)&attributes->maxValue + lVar7);
                  if (*pfVar2 <= fVar12 && fVar12 != *pfVar2) {
                    *(float *)((long)&attributes->maxValue + lVar7) = fVar12;
                  }
                  if (fVar12 < *(float *)((long)&attributes->minValue + lVar7)) {
                    *(float *)((long)&attributes->minValue + lVar7) = fVar12;
                  }
                  if ((RM_FileHandle **)attrIt._0_8_ != ppRVar1) {
                    operator_delete((void *)attrIt._0_8_);
                  }
                  lVar10 = lVar10 + 1;
                  lVar7 = lVar7 + 0x30;
                } while (lVar10 < relEntry->attrCount);
              }
              relEntry->numTuples = relEntry->numTuples + 1;
            }
            pRVar9 = &local_1b8->relcatFH;
            RVar4 = RM_FileHandle::UpdateRec(pRVar9,&relRec);
            if (RVar4 == 0) {
              RVar4 = RM_FileHandle::ForcePages(pRVar9,-1);
              if (RVar4 == 0) {
                SM_AttrIterator::SM_AttrIterator(&attrIt);
                pRVar9 = &local_1b8->attrcatFH;
                RVar4 = SM_AttrIterator::OpenIterator(&attrIt,pRVar9,relEntry->relName);
                if (RVar4 == 0) {
                  RM_Record::RM_Record(&attrRec);
                  if (0 < relEntry->attrCount) {
                    iVar6 = 0;
                    do {
                      RVar4 = SM_AttrIterator::GetNextAttr(&attrIt,&attrRec,&aEntry);
                      if (RVar4 != 0) goto LAB_0010b42b;
                      iVar3 = aEntry->attrNum;
                      fVar12 = attributes[iVar3].minValue;
                      aEntry->maxValue = attributes[iVar3].maxValue;
                      aEntry->minValue = fVar12;
                      aEntry->numDistinct =
                           (int)numDistinct.
                                super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar3]._M_t._M_impl.
                                super__Rb_tree_header._M_node_count;
                      RVar4 = RM_FileHandle::UpdateRec(pRVar9,&attrRec);
                      if (RVar4 != 0) goto LAB_0010b42b;
                      iVar6 = iVar6 + 1;
                    } while (iVar6 < relEntry->attrCount);
                  }
                  RVar4 = SM_AttrIterator::CloseIterator(&attrIt);
                  if (RVar4 == 0) {
                    RVar4 = RM_FileHandle::ForcePages(pRVar9,-1);
                  }
LAB_0010b42b:
                  RM_Record::~RM_Record(&attrRec);
                }
                SM_AttrIterator::~SM_AttrIterator(&attrIt);
              }
            }
          }
        }
LAB_0010b1bb:
        RM_Record::~RM_Record(&rec);
        RM_FileHandle::~RM_FileHandle(&fh);
        RM_FileScan::~RM_FileScan(&fs);
        std::
        vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&numDistinct);
      }
    }
    RM_Record::~RM_Record(&relRec);
  }
  return RVar4;
}

Assistant:

RC SM_Manager::CalcStats(const char *relName){
  RC rc = 0;
  cout << "Calculating stats for relation " << relName << endl;
  if(strlen(relName) > MAXNAME) // check for whether this is a valid name
    return (SM_BADRELNAME);

  // Retrieve the record associated with the relation
  RM_Record relRec;
  RelCatEntry *relEntry;
  if((rc = GetRelEntry(relName, relRec, relEntry)))
    return (rc);

  // Creates a struct containing info about the attributes to 
  // help with loading
  Attr* attributes = (Attr *)malloc(sizeof(Attr)*relEntry->attrCount);
  for(int i=0; i < relEntry->attrCount; i++){
    memset((void*)&attributes[i], 0, sizeof(attributes[i]));
    IX_IndexHandle ih;
    attributes[i] = (Attr) {0, 0, 0, 0, ih, recInsert_string, 0, FLT_MIN, FLT_MAX};
  }
  if((rc = PrepareAttr(relEntry, attributes)))
    return (rc);

  vector<set<string> > numDistinct(relEntry->attrCount);
  for(int i=0; i < relEntry->attrCount; i++){
    attributes[i].numDistinct = 0;
    attributes[i].maxValue = FLT_MIN;
    attributes[i].minValue = FLT_MAX;
  }
  relEntry->numTuples = 0;
  relEntry->statsInitialized = true;

  // Open the relation and iterate through it
  RM_FileScan fs;
  RM_FileHandle fh;
  RM_Record rec;
  if((rc = rmm.OpenFile(relName, fh)) || (rc = fs.OpenScan(fh, INT, 0, 0, NO_OP, NULL)))
    return (rc);
  while(RM_EOF != fs.GetNextRec(rec)){
    char * recData;
    if((rc = rec.GetData(recData)))
      return (rc);

    for(int i = 0;  i < relEntry->attrCount; i++){
      int offset = attributes[i].offset;
      string attr(recData + offset, recData + offset + attributes[i].length);
      numDistinct[i].insert(attr);
      float attrValue = 0.0;
      if(attributes[i].type == STRING)
        attrValue = ConvertStrToFloat(recData + offset);
      else if(attributes[i].type == INT)
        attrValue = (float) *((int*) (recData + offset));
      else
        attrValue = *((float*)(recData + offset));
      if(attrValue > attributes[i].maxValue)
        attributes[i].maxValue = attrValue;
      if(attrValue < attributes[i].minValue)
        attributes[i].minValue = attrValue;
    }
    relEntry->numTuples++;

  }

  // write everything back
  if((rc = relcatFH.UpdateRec(relRec)) || (rc = relcatFH.ForcePages()))
    return (rc);

  SM_AttrIterator attrIt;
  if((rc = attrIt.OpenIterator(attrcatFH, relEntry->relName)))
    return (rc);
  RM_Record attrRec;
  AttrCatEntry *aEntry;
  for(int i = 0; i < relEntry->attrCount; i++){
    if((rc = attrIt.GetNextAttr(attrRec, aEntry)))
      return (rc);
    // For each attribute, place its information in the appropriate slot
    int slot = aEntry->attrNum;
    aEntry->minValue = attributes[slot].minValue;
    aEntry->maxValue = attributes[slot].maxValue;
    aEntry->numDistinct = numDistinct[slot].size();
    if((rc = attrcatFH.UpdateRec(attrRec)))
      return (rc);
  }
  if((rc = attrIt.CloseIterator()))
    return (rc);
  if((rc = attrcatFH.ForcePages()))
    return (rc);


  return (0);
}